

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CFLSubsampleHBDTest_SubsampleHBD444Test_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CFLSubsampleHBDTest_SubsampleHBD444Test_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<unsigned_char,void(*(*)(unsigned_char))(unsigned_short_const*,int,unsigned_short*),void(*(*)(unsigned_char))(unsigned_short_const*,int,unsigned_short*),void(*(*)(unsigned_char))(unsigned_short_const*,int,unsigned_short*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x1060);
  Test::Test(this_00);
  *(undefined4 *)
   ((long)&this_00[2].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 4) =
       0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__CFLSubsampleTest_0103bed8;
  this_00[1]._vptr_Test = (_func_int **)&PTR__CFLSubsampleHBDTest_SubsampleHBD444Test_Test_0103bf18;
  this_00[1].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__CFLSubsampleHBDTest_SubsampleHBD444Test_Test_0103bf38;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }